

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::visitFunction
          (HeapStoreOptimization *this,Function *curr)

{
  size_t *__return_storage_ptr__;
  Id IVar1;
  pointer puVar2;
  BasicBlock *pBVar3;
  pointer pppEVar4;
  Expression **ppEVar5;
  StructSet *set;
  LocalSet *pLVar6;
  StructNew *new_;
  StructSet *set_00;
  bool bVar7;
  uint uVar8;
  pointer puVar9;
  Expression **ppEVar10;
  ulong index;
  Expression *pEVar11;
  Expression **ppEVar12;
  pointer pppEVar13;
  ulong index_00;
  uint uVar14;
  undefined1 local_338 [8];
  EffectAnalyzer firstEffects;
  
  puVar9 = (this->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
           .basicBlocks.
           super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
           .basicBlocks.
           super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar9 == puVar2) {
      return;
    }
    pBVar3 = (puVar9->_M_t).
             super___uniq_ptr_impl<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
             .
             super__Head_base<0UL,_wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
             ._M_head_impl;
    pppEVar4 = *(pointer *)((long)&(pBVar3->contents).actions + 8);
    for (pppEVar13 = *(pointer *)&(pBVar3->contents).actions; pppEVar13 != pppEVar4;
        pppEVar13 = pppEVar13 + 1) {
      ppEVar5 = *pppEVar13;
      set = (StructSet *)*ppEVar5;
      IVar1 = (set->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression._id;
      if (IVar1 == BlockId) {
        ppEVar5 = &set->value;
        for (uVar8 = 0; (ulong)uVar8 < *(ulong *)&set->order; uVar8 = uVar8 + 1) {
          ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                     operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 *)ppEVar5,(ulong)uVar8);
          pLVar6 = (LocalSet *)*ppEVar10;
          if (((pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id ==
               LocalSetId) &&
             (new_ = (StructNew *)pLVar6->value, uVar14 = uVar8,
             (new_->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id ==
             StructNewId)) {
            while( true ) {
              index = (ulong)uVar14;
              while( true ) {
                uVar14 = uVar14 + 1;
                index_00 = (ulong)uVar14;
                if (*(ulong *)&set->order <= index_00) goto LAB_00a2ed75;
                ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                           operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       *)ppEVar5,index_00);
                set_00 = (StructSet *)*ppEVar10;
                if ((((set_00->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.
                      _id != StructSetId) || (set_00->ref->_id != LocalGetId)) ||
                   (*(Index *)(set_00->ref + 1) != pLVar6->index)) break;
                bVar7 = optimizeSubsequentStructSet(this,new_,set_00,pLVar6);
                if (!bVar7) goto LAB_00a2ed75;
                (set_00->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression._id =
                     NopId;
                (set_00->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.type.
                id = 0;
              }
              if (*(long *)&set->order - 1U == index_00) goto LAB_00a2ed75;
              ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                         operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     *)ppEVar5,index_00);
              if ((*ppEVar10)->_id == LocalSetId) {
                ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                           operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       *)ppEVar5,index_00);
                pEVar11 = *ppEVar10;
                if (pEVar11->_id != LocalSetId) {
                  pEVar11 = (Expression *)0x0;
                }
                if (*(char *)pEVar11[1].type.id == 'A') goto LAB_00a2ed75;
              }
              ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                         operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     *)ppEVar5,index);
              effects((EffectAnalyzer *)local_338,this,*ppEVar10);
              ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                         operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     *)ppEVar5,index_00);
              __return_storage_ptr__ =
                   &firstEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
              effects((EffectAnalyzer *)__return_storage_ptr__,this,*ppEVar10);
              bVar7 = EffectAnalyzer::invalidates
                                ((EffectAnalyzer *)__return_storage_ptr__,
                                 (EffectAnalyzer *)local_338);
              if (bVar7) break;
              ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                         operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     *)ppEVar5,index);
              ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                         operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     *)ppEVar5,index_00);
              pEVar11 = *ppEVar10;
              *ppEVar10 = *ppEVar12;
              *ppEVar12 = pEVar11;
              EffectAnalyzer::~EffectAnalyzer
                        ((EffectAnalyzer *)
                         &firstEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_338);
            }
            EffectAnalyzer::~EffectAnalyzer
                      ((EffectAnalyzer *)
                       &firstEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
            EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_338);
          }
LAB_00a2ed75:
        }
      }
      else {
        if (IVar1 != StructSetId) {
          handle_unreachable("bad action",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/HeapStoreOptimization.cpp"
                             ,0x4c);
        }
        pLVar6 = (LocalSet *)set->ref;
        if ((((pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id ==
              LocalSetId) &&
            ((((StructNew *)pLVar6->value)->super_SpecificExpression<(wasm::Expression::Id)65>).
             super_Expression._id == StructNewId)) &&
           (bVar7 = optimizeSubsequentStructSet(this,(StructNew *)pLVar6->value,set,pLVar6), bVar7))
        {
          LocalSet::makeSet(pLVar6);
          *ppEVar5 = (Expression *)pLVar6;
        }
      }
    }
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

void visitFunction(Function* curr) {
    // Now that the walk is complete and we have a CFG, find things to optimize.
    for (auto& block : basicBlocks) {
      for (auto** currp : block->contents.actions) {
        auto* curr = *currp;
        if (auto* set = curr->dynCast<StructSet>()) {
          optimizeStructSet(set, currp);
        } else if (auto* block = curr->dynCast<Block>()) {
          optimizeBlock(block);
        } else {
          WASM_UNREACHABLE("bad action");
        }
      }
    }
  }